

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O3

Action __thiscall
psy::C::SyntaxDumper::visitAssignmentExpression(SyntaxDumper *this,AssignmentExpressionSyntax *node)

{
  SyntaxToken local_50;
  
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
            (this,(node->super_MIXIN_LeftExpressionInfixOperatorRightExpression).leftExpr_);
  SyntaxNode::tokenAtIndex
            (&local_50,(SyntaxNode *)node,
             (node->super_MIXIN_LeftExpressionInfixOperatorRightExpression).oprtrTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
            (this,(node->super_MIXIN_LeftExpressionInfixOperatorRightExpression).rightExpr_);
  return Skip;
}

Assistant:

virtual Action visitAssignmentExpression(const AssignmentExpressionSyntax* node) override
    {
        nonterminal(node->left());
        terminal(node->operatorToken(), node);
        nonterminal(node->right());
        return Action::Skip;
    }